

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

QVariant * __thiscall
QTableModel::headerData(QTableModel *this,int section,Orientation orientation,int role)

{
  qsizetype qVar1;
  const_reference ppQVar2;
  QList<QTableWidgetItem_*> *this_00;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  QVariant *in_RDI;
  uint in_R8D;
  QTableWidgetItem *itm;
  qsizetype in_stack_ffffffffffffffa8;
  QList<QTableWidgetItem_*> *in_stack_ffffffffffffffb0;
  QTableWidgetItem *local_28;
  
  if (in_EDX < 0) {
    ::QVariant::QVariant((QVariant *)0x8d7bc7);
    return in_RDI;
  }
  if ((in_ECX == 1) &&
     (qVar1 = QList<QTableWidgetItem_*>::size((QList<QTableWidgetItem_*> *)(in_RSI + 0x48)),
     in_EDX < qVar1)) {
    ppQVar2 = QList<QTableWidgetItem_*>::at(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_28 = *ppQVar2;
LAB_008d7c75:
    if (local_28 == (QTableWidgetItem *)0x0) {
      if (in_R8D == 0) {
        ::QVariant::QVariant(in_RDI,in_EDX + 1);
      }
      else {
        ::QVariant::QVariant((QVariant *)0x8d7cb7);
      }
    }
    else {
      (*local_28->_vptr_QTableWidgetItem[3])(in_RDI,local_28,(ulong)in_R8D);
    }
  }
  else {
    if (in_ECX == 2) {
      this_00 = (QList<QTableWidgetItem_*> *)(long)in_EDX;
      qVar1 = QList<QTableWidgetItem_*>::size((QList<QTableWidgetItem_*> *)(in_RSI + 0x30));
      if ((long)this_00 < qVar1) {
        ppQVar2 = QList<QTableWidgetItem_*>::at(this_00,in_stack_ffffffffffffffa8);
        local_28 = *ppQVar2;
        goto LAB_008d7c75;
      }
    }
    ::QVariant::QVariant((QVariant *)0x8d7c71);
  }
  return in_RDI;
}

Assistant:

QVariant QTableModel::headerData(int section, Qt::Orientation orientation, int role) const
{
    if (section < 0)
        return QVariant();

    QTableWidgetItem *itm = nullptr;
    if (orientation == Qt::Horizontal && section < horizontalHeaderItems.size())
        itm = horizontalHeaderItems.at(section);
    else if (orientation == Qt::Vertical && section < verticalHeaderItems.size())
        itm = verticalHeaderItems.at(section);
    else
        return QVariant(); // section is out of bounds

    if (itm)
        return itm->data(role);
    if (role == Qt::DisplayRole)
        return section + 1;
    return QVariant();
}